

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

void ON_RenderContentPrivate::SetModel(ON_RenderContent *rc,ONX_Model *model)

{
  ON_RenderContent *rc_00;
  ChildIterator it;
  ChildIterator CStack_18;
  
  rc->_private->m_model = model;
  (*(rc->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2f])(&CStack_18,rc);
  while( true ) {
    rc_00 = (CStack_18._private)->_current;
    if (rc_00 == (ON_RenderContent *)0x0) break;
    (CStack_18._private)->_current = rc_00->_private->m_next_sibling;
    SetModel(rc_00,model);
  }
  ON_RenderContent::ChildIterator::~ChildIterator(&CStack_18);
  return;
}

Assistant:

void ON_RenderContentPrivate::SetModel(const ON_RenderContent& rc, ONX_Model& model) // Static.
{
  rc._private->m_model = &model;

  auto it = rc.GetChildIterator();
  ON_RenderContent* child_rc = nullptr;
  while (nullptr != (child_rc = it.GetNextChild()))
  {
    SetModel(*child_rc, model);
  }
}